

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O3

int storestring(char *n,char **p,int nostrip)

{
  byte *pbVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  
  if (*p == n) {
    return 0;
  }
  undo_checkpoint();
  if (n == (char *)0x0) {
    pcVar4 = (char *)0x0;
    iVar5 = 0;
  }
  else {
    if (nostrip == 0) {
      n = n + -1;
      do {
        pbVar1 = (byte *)(n + 1);
        n = n + 1;
        iVar5 = isspace((uint)*pbVar1);
      } while (iVar5 != 0);
      sVar3 = strlen(n);
      pcVar4 = n + sVar3;
      do {
        pcVar6 = pcVar4;
        if (pcVar6 <= n) break;
        iVar5 = isspace((uint)(byte)pcVar6[-1]);
        pcVar4 = pcVar6 + -1;
      } while (iVar5 != 0);
    }
    else {
      sVar3 = strlen(n);
      pcVar6 = n + sVar3;
    }
    iVar5 = (int)pcVar6 - (int)n;
    pcVar4 = (char *)0x0;
    if (iVar5 != 0) {
      pcVar4 = n;
    }
  }
  pcVar6 = *p;
  if (pcVar4 == pcVar6) {
    return 0;
  }
  if (pcVar6 == (char *)0x0 || pcVar4 == (char *)0x0) {
    if (pcVar6 == (char *)0x0) goto LAB_00180eec;
  }
  else {
    iVar2 = strncmp(pcVar4,pcVar6,(long)iVar5);
    if ((iVar2 == 0) && (pcVar6[iVar5] == '\0')) {
      return 0;
    }
  }
  free(pcVar6);
LAB_00180eec:
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = (char *)malloc((long)(iVar5 + 1));
    fl_strlcpy(pcVar6,pcVar4,(long)(iVar5 + 1));
  }
  *p = pcVar6;
  set_modflag(1);
  return 1;
}

Assistant:

int storestring(const char *n, const char * & p, int nostrip) {
  if (n == p) return 0;
  undo_checkpoint();
  int length = 0;
  if (n) { // see if blank, strip leading & trailing blanks
    if (!nostrip) while (isspace((int)(unsigned char)*n)) n++;
    const char *e = n + strlen(n);
    if (!nostrip) while (e > n && isspace((int)(unsigned char)*(e-1))) e--;
    length = e-n;
    if (!length) n = 0;
  }    
  if (n == p) return 0;
  if (n && p && !strncmp(n,p,length) && !p[length]) return 0;
  if (p) free((void *)p);
  if (!n || !*n) {
    p = 0;
  } else {
    char *q = (char *)malloc(length+1);
    strlcpy(q,n,length+1);
    p = q;
  }
  set_modflag(1);
  return 1;
}